

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O3

GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::operator=(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            *this,GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  *rhs)

{
  size_t sVar1;
  
  if (this != rhs) {
    if (this->nameBuffer_ != (Ch *)0x0) {
      free(this->tokens_);
    }
    sVar1 = rhs->parseErrorOffset_;
    this->tokenCount_ = rhs->tokenCount_;
    this->parseErrorOffset_ = sVar1;
    this->parseErrorCode_ = rhs->parseErrorCode_;
    if (rhs->nameBuffer_ == (Ch *)0x0) {
      this->tokens_ = rhs->tokens_;
      this->nameBuffer_ = (Ch *)0x0;
    }
    else {
      CopyFromRaw(this,rhs,0,0);
    }
  }
  return this;
}

Assistant:

GenericPointer& operator=(const GenericPointer& rhs) {
        if (this != &rhs) {
            // Do not delete ownAllcator
            if (nameBuffer_)
                Allocator::Free(tokens_);

            tokenCount_ = rhs.tokenCount_;
            parseErrorOffset_ = rhs.parseErrorOffset_;
            parseErrorCode_ = rhs.parseErrorCode_;

            if (rhs.nameBuffer_)
                CopyFromRaw(rhs); // Normally parsed tokens.
            else {
                tokens_ = rhs.tokens_; // User supplied const tokens.
                nameBuffer_ = 0;
            }
        }
        return *this;
    }